

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.h
# Opt level: O1

void interpolate<int(*)[2],PointPlotter<int>>
               (int (*p0) [2],int (*pn) [2],PointPlotter<int> plot,double res)

{
  int (*paiVar1) [2];
  int (*paiVar2) [2];
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  
  paiVar1 = p0 + 2;
  if (paiVar1 != pn) {
    paiVar2 = p0 + 3;
    do {
      dVar5 = (double)p0[1][0];
      dVar6 = (double)(*paiVar1)[0];
      if ((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) {
        dVar8 = (double)(*p0)[0];
        if ((dVar8 != dVar5) || (NAN(dVar8) || NAN(dVar5))) {
LAB_0013adb3:
          dVar7 = (double)(*paiVar2)[0];
          dVar8 = ((double)(*paiVar1)[1] - (double)(*p0)[1]) / (dVar6 - dVar8);
          if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
            dVar7 = ((double)(*paiVar2)[1] - (double)p0[1][1]) / (dVar7 - dVar5);
          }
          else {
            dVar7 = ((((double)(*paiVar1)[1] - (double)p0[1][1]) * 3.0) / (dVar6 - dVar5) - dVar8) *
                    0.5;
          }
        }
        else if ((dVar6 != (double)(*paiVar2)[0]) || (NAN(dVar6) || NAN((double)(*paiVar2)[0]))) {
          if ((dVar8 != dVar5) || (NAN(dVar8) || NAN(dVar5))) goto LAB_0013adb3;
          auVar9._0_8_ = ((double)(*paiVar1)[1] - (double)p0[1][1]) * 3.0;
          auVar9._8_8_ = (double)(*paiVar2)[1] - (double)p0[1][1];
          dVar8 = (double)(*paiVar2)[0] - dVar5;
          auVar10._8_4_ = SUB84(dVar8,0);
          auVar10._0_8_ = dVar6 - dVar5;
          auVar10._12_4_ = (int)((ulong)dVar8 >> 0x20);
          auVar10 = divpd(auVar9,auVar10);
          dVar7 = auVar10._8_8_;
          dVar8 = (auVar10._0_8_ - dVar7) * 0.5;
        }
        else {
          dVar7 = ((double)(*paiVar1)[1] - (double)p0[1][1]) / (dVar6 - dVar5);
          dVar8 = dVar7;
        }
        dVar13 = dVar6 - dVar5;
        dVar11 = (double)(*paiVar1)[1] - (double)p0[1][1];
        dVar11 = ((dVar8 + dVar7) - (dVar11 + dVar11) / dVar13) / (dVar13 * dVar13);
        if (dVar5 <= dVar6) {
          dVar12 = ((dVar5 + dVar6) * -3.0 * dVar11 + (dVar7 - dVar8) / dVar13) * 0.5;
          dVar13 = dVar12 + dVar12;
          dVar7 = (dVar11 * 6.0 * (dVar5 + res) + dVar13) * res * res;
          dVar8 = dVar8 - (dVar5 * 3.0 * dVar11 + dVar13) * dVar5;
          dVar13 = (dVar11 * 3.0 * (dVar5 + res) + dVar13) * dVar5 * res +
                   ((dVar11 * res + dVar12) * res + dVar8) * res;
          dVar8 = ((dVar11 * dVar5 + dVar12) * dVar5 + dVar8) * dVar5;
          dVar8 = ((double)p0[1][1] - dVar8) + dVar8;
          do {
            uVar3 = 0;
            uVar4 = 0;
            if (0.0 <= dVar8) {
              uVar3 = SUB84(dVar8,0);
              uVar4 = (undefined4)((ulong)dVar8 >> 0x20);
            }
            plot.f[(int)dVar5] = (int)(double)CONCAT44(uVar4,uVar3);
            dVar8 = dVar8 + dVar13;
            dVar13 = dVar13 + dVar7;
            dVar7 = dVar7 + dVar11 * 6.0 * res * res * res;
            dVar5 = dVar5 + res;
          } while (dVar5 <= dVar6);
        }
      }
      p0 = p0 + 1;
      paiVar1 = paiVar1 + 1;
      paiVar2 = paiVar2 + 1;
    } while (paiVar1 != pn);
  }
  return;
}

Assistant:

inline
void interpolate(PointIter p0, PointIter pn, PointPlotter plot, double res)
{
  double k1, k2;

  // Set up points for first curve segment.
  PointIter p1 = p0; ++p1;
  PointIter p2 = p1; ++p2;
  PointIter p3 = p2; ++p3;

  // Draw each curve segment.
  for (; p2 != pn; ++p0, ++p1, ++p2, ++p3) {
    // p1 and p2 equal; single point.
    if (x(p1) == x(p2)) {
      continue;
    }
    // Both end points repeated; straight line.
    if (x(p0) == x(p1) && x(p2) == x(p3)) {
      k1 = k2 = (y(p2) - y(p1))/(x(p2) - x(p1));
    }
    // p0 and p1 equal; use f''(x1) = 0.
    else if (x(p0) == x(p1)) {
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
      k1 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k2)/2;
    }
    // p2 and p3 equal; use f''(x2) = 0.
    else if (x(p2) == x(p3)) {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k1)/2;
    }
    // Normal curve.
    else {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
    }

    interpolate_segment(x(p1), y(p1), x(p2), y(p2), k1, k2, plot, res);
  }
}